

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O0

void __thiscall
gui::ChatBox::setSizeCharacters(ChatBox *this,Vector2<unsigned_long> *sizeCharacters)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  unsigned_long uVar4;
  bool bVar5;
  uint uVar6;
  element_type *peVar7;
  Vector2<unsigned_long> *in_RSI;
  long in_RDI;
  float X;
  FloatRect FVar8;
  FloatRect bounds;
  string textBounds;
  undefined1 in_stack_000001ff;
  ChatBox *in_stack_00000200;
  Text *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  float local_f4;
  locale *local_c8;
  string *in_stack_ffffffffffffff48;
  Text *this_00;
  Vector2<float> local_88;
  undefined8 local_80;
  undefined8 local_78;
  locale local_70 [63];
  allocator local_31;
  string local_30 [32];
  Vector2<unsigned_long> *local_10;
  
  local_10 = in_RSI;
  bVar5 = sf::operator==((Vector2<unsigned_long> *)(in_RDI + 0x2a0),in_RSI);
  if (!bVar5) {
    uVar4 = local_10->y;
    *(unsigned_long *)(in_RDI + 0x2a0) = local_10->x;
    *(unsigned_long *)(in_RDI + 0x2a8) = uVar4;
    uVar3 = local_10->x;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,uVar3,'A',&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    peVar7 = std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x232c28);
    this_00 = &peVar7->text_;
    std::locale::locale(local_70);
    sf::String::String((String *)this_00,in_stack_ffffffffffffff48,local_c8);
    sf::Text::setString((Text *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        (String *)in_stack_fffffffffffffef8);
    sf::String::~String((String *)0x232c82);
    std::locale::~locale(local_70);
    std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x232ca0);
    FVar8 = sf::Text::getLocalBounds(in_stack_fffffffffffffef8);
    local_78 = FVar8._8_8_;
    local_80 = FVar8._0_8_;
    peVar7 = std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x232ced);
    fVar1 = (peVar7->textPadding_).x;
    X = fVar1 + fVar1 + (float)local_80 + (float)local_78;
    peVar7 = std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x232d23);
    fVar1 = (peVar7->textPadding_).y;
    peVar7 = std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x232d3b);
    fVar2 = (peVar7->textPadding_).z;
    std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x232d53);
    uVar6 = ChatBoxStyle::getCharacterSize((ChatBoxStyle *)0x232d5b);
    local_f4 = (float)local_10->y;
    sf::Vector2<float>::Vector2(&local_88,X,fVar1 + fVar1 + fVar2 * (float)uVar6 * local_f4);
    *(Vector2<float> *)(in_RDI + 700) = local_88;
    updateVisibleLines(in_stack_00000200,(bool)in_stack_000001ff);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void ChatBox::setSizeCharacters(const sf::Vector2<size_t>& sizeCharacters) {
    if (sizeCharacters_ == sizeCharacters) {
        return;
    }
    sizeCharacters_ = sizeCharacters;

    std::string textBounds(sizeCharacters.x, 'A');
    style_->text_.setString(textBounds);

    const auto bounds = style_->text_.getLocalBounds();
    size_ = sf::Vector2f(
        2.0f * style_->textPadding_.x + bounds.left + bounds.width,
        2.0f * style_->textPadding_.y + style_->textPadding_.z * style_->getCharacterSize() * sizeCharacters.y
    );

    updateVisibleLines();
}